

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.cpp
# Opt level: O2

void __thiscall r_exec::Group::inject_new_object(Group *this,View *view)

{
  _Object *p_Var1;
  char cVar2;
  uint uVar3;
  int iVar4;
  undefined4 extraout_var;
  uint64_t i;
  ulong uVar6;
  Code *local_30;
  long *plVar5;
  
  p_Var1 = (view->super_View).object.object;
  (*p_Var1->_vptr__Object[4])(p_Var1,0);
  cVar2 = r_code::Atom::getDescriptor();
  if (cVar2 == -0x3c) {
    uVar6 = 0;
    while( true ) {
      uVar3 = (*((view->super_View).object.object)->_vptr__Object[10])();
      if ((uVar3 & 0xffff) <= uVar6) break;
      p_Var1 = (view->super_View).object.object;
      iVar4 = (*p_Var1->_vptr__Object[9])(p_Var1,uVar6 & 0xffff);
      plVar5 = (long *)CONCAT44(extraout_var,iVar4);
      (**(code **)(*plVar5 + 0x98))(plVar5);
      local_30 = (Code *)(view->super_View).object.object;
      r_code::list<r_code::Code_*>::push_back((list<r_code::Code_*> *)(plVar5 + 3),&local_30);
      (**(code **)(*plVar5 + 0xa0))(plVar5);
      uVar6 = uVar6 + 1;
    }
  }
  inject(this,view);
  notifyNew(this,view);
  return;
}

Assistant:

void Group::inject_new_object(View *view)   // the view can hold anything but groups and notifications.
{
    //uint64_t t0=Now();
    switch (view->object->code(0).getDescriptor()) {
    case Atom::MARKER: // the marker does not exist yet: add it to the mks of its references.
        for (uint64_t i = 0; i < view->object->references_size(); ++i) {
            Code *ref = view->object->get_reference(i);
            ref->acq_markers();
            ref->markers.push_back(view->object);
            ref->rel_markers();
        }

        break;

    default:
        break;
    }

    inject(view);
    notifyNew(view);
    //uint64_t t1=Now();
    //std::cout<<"injection: "<<t1-t0<<std::endl;
}